

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_toolbar.cpp
# Opt level: O1

int __thiscall QtMWidgets::ToolBar::qt_metacall(ToolBar *this,Call _c,int _id,void **_a)

{
  int _id_00;
  undefined8 *puVar1;
  undefined4 in_register_00000014;
  
  _id_00 = QWidget::qt_metacall((Call)this,_c,(void **)CONCAT44(in_register_00000014,_id));
  if (_id_00 < 0) {
    return _id_00;
  }
  if (BindableProperty < _c) {
    return _id_00;
  }
  if ((0x14eU >> (_c & 0x1f) & 1) != 0) {
    qt_static_metacall((QObject *)this,_c,_id_00,_a);
    return _id_00 + -3;
  }
  if (_c == InvokeMetaMethod) {
    if (_id_00 < 8) {
      qt_static_metacall((QObject *)this,InvokeMetaMethod,_id_00,_a);
    }
  }
  else {
    if (_c != RegisterMethodArgumentMetaType) {
      return _id_00;
    }
    if (_id_00 < 8) {
      if (_id_00 == 0) {
        puVar1 = (undefined8 *)*_a;
        if (*_a[1] == 0) {
          *puVar1 = &QtPrivate::QMetaTypeInterfaceWrapper<QAction_*>::metaType;
          goto LAB_00154e05;
        }
      }
      else {
        puVar1 = (undefined8 *)*_a;
      }
      *puVar1 = 0;
    }
  }
LAB_00154e05:
  return _id_00 + -8;
}

Assistant:

int QtMWidgets::ToolBar::qt_metacall(QMetaObject::Call _c, int _id, void **_a)
{
    _id = QWidget::qt_metacall(_c, _id, _a);
    if (_id < 0)
        return _id;
    if (_c == QMetaObject::InvokeMetaMethod) {
        if (_id < 8)
            qt_static_metacall(this, _c, _id, _a);
        _id -= 8;
    } else if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        if (_id < 8)
            qt_static_metacall(this, _c, _id, _a);
        _id -= 8;
    }
#ifndef QT_NO_PROPERTIES
    else if (_c == QMetaObject::ReadProperty || _c == QMetaObject::WriteProperty
            || _c == QMetaObject::ResetProperty || _c == QMetaObject::BindableProperty
            || _c == QMetaObject::RegisterPropertyMetaType) {
        qt_static_metacall(this, _c, _id, _a);
        _id -= 3;
    }
#endif // QT_NO_PROPERTIES
    return _id;
}